

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_sample_locations
          (Impl *this,Value *state,VkPipelineSampleLocationsStateCreateInfoEXT **out_info)

{
  double dVar1;
  undefined8 uVar2;
  VkPipelineSampleLocationsStateCreateInfoEXT *pVVar3;
  Type pGVar4;
  Number NVar5;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar6;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar7;
  VkSampleLocationEXT *pVVar8;
  Type pGVar9;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *elem;
  ulong uVar10;
  undefined8 local_30;
  
  pVVar3 = (VkPipelineSampleLocationsStateCreateInfoEXT *)
           ScratchAllocator::allocate_raw(&this->allocator,0x40,0x10);
  if (pVVar3 != (VkPipelineSampleLocationsStateCreateInfoEXT *)0x0) {
    *(undefined8 *)&(pVVar3->sampleLocationsInfo).sampleLocationGridSize.height = 0;
    (pVVar3->sampleLocationsInfo).pSampleLocations = (VkSampleLocationEXT *)0x0;
    (pVVar3->sampleLocationsInfo).pNext = (void *)0x0;
    (pVVar3->sampleLocationsInfo).sampleLocationsPerPixel = 0;
    (pVVar3->sampleLocationsInfo).sampleLocationGridSize.width = 0;
    *(undefined8 *)&pVVar3->sampleLocationsEnable = 0;
    *(undefined8 *)&pVVar3->sampleLocationsInfo = 0;
    *(undefined8 *)pVVar3 = 0;
    pVVar3->pNext = (void *)0x0;
  }
  *out_info = pVVar3;
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"sampleLocationsEnable");
  if ((undefined1  [16])((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000) !=
      (undefined1  [16])0x0) {
    pVVar3->sampleLocationsEnable = (pGVar4->data_).s.length;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&stack0xffffffffffffffd0,(Ch *)state);
    uVar2 = local_30;
    NVar5.i = (I)rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::MemberEnd(state);
    if (uVar2 == NVar5.i64) {
      return true;
    }
    pGVar6 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)rapidjson::
                GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ::operator[]<char_const>
                          ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            *)state,"sampleLocationsInfo");
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(pGVar6,"sType");
    if ((undefined1  [16])((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000) !=
        (undefined1  [16])0x0) {
      (pVVar3->sampleLocationsInfo).sType = (pGVar4->data_).s.length;
      pGVar4 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(pGVar6,"sampleLocationsPerPixel");
      if ((undefined1  [16])((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000)
          != (undefined1  [16])0x0) {
        (pVVar3->sampleLocationsInfo).sampleLocationsPerPixel = (pGVar4->data_).s.length;
        pGVar7 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  *)rapidjson::
                    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ::operator[]<char_const>(pGVar6,"sampleLocationGridSize");
        pGVar4 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>(pGVar7,"width");
        if ((undefined1  [16])((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000)
            != (undefined1  [16])0x0) {
          (pVVar3->sampleLocationsInfo).sampleLocationGridSize.width = (pGVar4->data_).s.length;
          pGVar7 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    *)rapidjson::
                      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      ::operator[]<char_const>(pGVar6,"sampleLocationGridSize");
          pGVar4 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>(pGVar7,"height");
          if ((undefined1  [16])
              ((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000) !=
              (undefined1  [16])0x0) {
            (pVVar3->sampleLocationsInfo).sampleLocationGridSize.height = (pGVar4->data_).s.length;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)&stack0xffffffffffffffd0,(Ch *)pGVar6);
            NVar5.i = (I)rapidjson::
                         GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                      *)pGVar6);
            if (local_30 == NVar5.i64) {
              return true;
            }
            pGVar4 = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                     ::operator[]<char_const>(pGVar6,"sampleLocations");
            if ((pGVar4->data_).f.flags == 4) {
              uVar10 = (ulong)(pGVar4->data_).s.length;
              if (uVar10 == 0) {
                pVVar8 = (VkSampleLocationEXT *)0x0;
              }
              else {
                pVVar8 = (VkSampleLocationEXT *)
                         ScratchAllocator::allocate_raw(&this->allocator,uVar10 << 3,0x10);
                if ((pGVar4->data_).f.flags != 4) goto LAB_001259d6;
              }
              (pVVar3->sampleLocationsInfo).sampleLocationsCount = (pGVar4->data_).s.length;
              (pVVar3->sampleLocationsInfo).pSampleLocations = pVVar8;
              if ((pGVar4->data_).f.flags != 4) {
                __assert_fail("IsArray()",
                              "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                              ,0x68c,
                              "ValueIterator rapidjson::GenericValue<rapidjson::UTF8<>>::Begin() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                             );
              }
              pGVar7 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        *)((ulong)(pGVar4->data_).s.str & 0xffffffffffff);
              pGVar6 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        *)rapidjson::
                          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ::End(pGVar4);
              if (pGVar6 == pGVar7) {
                return true;
              }
              do {
                pGVar9 = rapidjson::
                         GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         ::operator[]<char_const>(pGVar7,"x");
                dVar1 = rapidjson::
                        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ::GetDouble(pGVar9);
                pVVar8->x = (float)dVar1;
                pGVar9 = rapidjson::
                         GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         ::operator[]<char_const>(pGVar7,"y");
                dVar1 = rapidjson::
                        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        ::GetDouble(pGVar9);
                pVVar8->y = (float)dVar1;
                pVVar8 = pVVar8 + 1;
                pGVar7 = pGVar7 + 0x10;
                pGVar6 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)rapidjson::
                            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ::End(pGVar4);
              } while (pGVar7 != pGVar6);
              return true;
            }
LAB_001259d6:
            __assert_fail("IsArray()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                          ,0x66a,
                          "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::Size() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                         );
          }
        }
      }
    }
  }
  __assert_fail("data_.f.flags & kUintFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x719,
                "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool StateReplayer::Impl::parse_sample_locations(const Value &state,
                                                 VkPipelineSampleLocationsStateCreateInfoEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkPipelineSampleLocationsStateCreateInfoEXT>();
	*out_info = info;

	info->sampleLocationsEnable = state["sampleLocationsEnable"].GetUint();
	if (state.HasMember("sampleLocationsInfo"))
	{
		auto &loc_info = state["sampleLocationsInfo"];
		info->sampleLocationsInfo.sType = static_cast<VkStructureType>(loc_info["sType"].GetUint());
		info->sampleLocationsInfo.sampleLocationsPerPixel = static_cast<VkSampleCountFlagBits>(loc_info["sampleLocationsPerPixel"].GetUint());
		info->sampleLocationsInfo.sampleLocationGridSize.width = loc_info["sampleLocationGridSize"]["width"].GetUint();
		info->sampleLocationsInfo.sampleLocationGridSize.height = loc_info["sampleLocationGridSize"]["height"].GetUint();

		if (loc_info.HasMember("sampleLocations"))
		{
			auto &locs = loc_info["sampleLocations"];

			auto *locations = allocator.allocate_n<VkSampleLocationEXT>(locs.Size());
			info->sampleLocationsInfo.sampleLocationsCount = uint32_t(locs.Size());
			info->sampleLocationsInfo.pSampleLocations = locations;

			for (auto itr = locs.Begin(); itr != locs.End(); ++itr)
			{
				auto &elem = *itr;
				locations->x = elem["x"].GetFloat();
				locations->y = elem["y"].GetFloat();
				locations++;
			}
		}
	}

	return true;
}